

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O3

size_t __thiscall CertificateList::SetDataSize(CertificateList *this)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  uVar1 = (this->tbsCertList).super_DerBase.cbData;
  lVar6 = 2;
  lVar5 = 2;
  if (((((0x7f < uVar1) && (lVar5 = 3, 0xff < uVar1)) && (lVar5 = 4, 0xffff < uVar1)) &&
      ((lVar5 = 5, 0xffffff < uVar1 && (lVar5 = 6, uVar1 >> 0x20 != 0)))) &&
     (lVar5 = 7, uVar1 >> 0x28 != 0)) {
    lVar5 = (ulong)(uVar1 >> 0x30 == 0) << 3;
  }
  uVar2 = (this->signatureAlgorithm).super_DerBase.cbData;
  if (((0x7f < uVar2) && (lVar6 = 3, 0xff < uVar2)) &&
     ((lVar6 = 4, 0xffff < uVar2 &&
      (((lVar6 = 5, 0xffffff < uVar2 && (lVar6 = 6, uVar2 >> 0x20 != 0)) &&
       (lVar6 = 7, uVar2 >> 0x28 != 0)))))) {
    lVar6 = (ulong)(uVar2 >> 0x30 == 0) << 3;
  }
  uVar3 = (this->signatureValue).super_DerBase.cbData;
  lVar7 = 2;
  if ((((0x7f < uVar3) && (lVar7 = 3, 0xff < uVar3)) &&
      ((lVar7 = 4, 0xffff < uVar3 &&
       ((lVar7 = 5, 0xffffff < uVar3 && (lVar7 = 6, uVar3 >> 0x20 != 0)))))) &&
     (lVar7 = 7, uVar3 >> 0x28 != 0)) {
    lVar7 = (ulong)(uVar3 >> 0x30 == 0) << 3;
  }
  sVar4 = uVar3 + lVar7 + uVar2 + lVar6 + lVar5 + uVar1;
  (this->super_DerBase).cbData = sVar4;
  return sVar4;
}

Assistant:

virtual size_t SetDataSize() override
	{
		cbData = tbsCertList.EncodedSize() + signatureAlgorithm.EncodedSize() + signatureValue.EncodedSize();
		return cbData;
	}